

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O3

value_type_conflict3 __thiscall standards::exp_number::operator_cast_to_double(exp_number *this)

{
  value_type_conflict3 vVar1;
  double dVar2;
  
  if (*(int *)(this + 8) == -1) {
    dVar2 = exp(*(double *)this);
    vVar1 = -dVar2;
  }
  else {
    vVar1 = 0.0;
    if (*(int *)(this + 8) == 1) {
      dVar2 = exp(*(double *)this);
      return dVar2;
    }
  }
  return vVar1;
}

Assistant:

operator value_type() const {
    if (sign_ == is_positive)
      return std::exp(log_);
    else if (sign_ == is_negative)
      return -std::exp(log_);
    else
      return 0;
  }